

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void sqlite3EndTable(Parse *pParse,Token *pCons,Token *pEnd,u8 tabOpts,Select *pSelect)

{
  short sVar1;
  u16 uVar2;
  Table *pTab;
  sqlite3 *db;
  Index *pIdx;
  i16 *piVar3;
  _func_int_sqlite3_ptr *z;
  undefined4 uVar4;
  LogEst LVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  uint uVar10;
  void *pvVar11;
  Vdbe *pVVar12;
  Parse *pPVar13;
  Table *pTable;
  VdbeOp *pVVar14;
  Expr *pExpr;
  ExprList *pList;
  Index *pIVar15;
  Token *pTVar16;
  ushort uVar17;
  u8 *puVar18;
  char *pcVar19;
  char *pcVar20;
  long lVar21;
  Column *pCVar22;
  ulong uVar23;
  char *pcVar24;
  int iVar25;
  Index **ppIVar26;
  char *zBuf;
  char *pcVar27;
  char *zFormat;
  bool bVar28;
  uint local_88;
  SelectDest dest;
  
  if (pEnd == (Token *)0x0 && pSelect == (Select *)0x0) {
    return;
  }
  pTab = pParse->pNewTable;
  if (pTab == (Table *)0x0) {
    return;
  }
  db = pParse->db;
  if ((db->init).busy != '\0') {
    if (pSelect != (Select *)0x0) {
      pcVar24 = "";
      goto LAB_0015d75d;
    }
    iVar6 = (db->init).newTnum;
    pTab->tnum = iVar6;
    if (iVar6 == 1) {
      *(byte *)&pTab->tabFlags = (byte)pTab->tabFlags | 1;
    }
  }
  if ((tabOpts & 0x20) == 0) goto LAB_0015d436;
  uVar10 = pTab->tabFlags;
  if ((uVar10 & 8) != 0) {
    pcVar24 = "AUTOINCREMENT not allowed on WITHOUT ROWID tables";
LAB_0015d75d:
    sqlite3ErrorMsg(pParse,pcVar24);
    return;
  }
  if ((uVar10 & 4) == 0) {
    sqlite3ErrorMsg(pParse,"PRIMARY KEY missing on table %s",pTab->zName);
    goto LAB_0015d436;
  }
  pTab->tabFlags = uVar10 | 0x60;
  pVVar12 = pParse->pVdbe;
  if (((db->init).field_0x6 & 2) == 0) {
    uVar17 = pTab->nCol;
    lVar21 = 0;
    if ((short)uVar17 < 1) {
      uVar17 = 0;
    }
    for (; (ulong)uVar17 * 0x20 != lVar21; lVar21 = lVar21 + 0x20) {
      if (((&pTab->aCol->colFlags)[lVar21] & 1) != 0) {
        (&pTab->aCol->notNull)[lVar21] = '\x02';
      }
    }
  }
  if (pParse->addrCrTab != 0) {
    pVVar14 = sqlite3VdbeGetOp(pVVar12,pParse->addrCrTab);
    pVVar14->p3 = 2;
  }
  if ((long)pTab->iPKey < 0) {
    pIVar15 = sqlite3PrimaryKeyIndex(pTab);
    iVar6 = 1;
    for (uVar23 = 1; uVar23 < pIVar15->nKeyCol; uVar23 = uVar23 + 1) {
      piVar3 = pIVar15->aiColumn;
      sVar1 = piVar3[uVar23];
      iVar7 = hasColumn(piVar3,iVar6,(int)sVar1);
      if (iVar7 == 0) {
        lVar21 = (long)iVar6;
        iVar6 = iVar6 + 1;
        piVar3[lVar21] = sVar1;
      }
      else {
        pIVar15->nColumn = pIVar15->nColumn - 1;
      }
    }
    pIVar15->nKeyCol = (u16)iVar6;
  }
  else {
    dest._0_8_ = pTab->aCol[pTab->iPKey].zName;
    iVar6 = sqlite3Strlen30((char *)dest._0_8_);
    dest.iSdst = iVar6;
    pExpr = sqlite3ExprAlloc(db,0x3b,(Token *)&dest,0);
    pList = sqlite3ExprListAppend(pParse,(ExprList *)0x0,pExpr);
    if (pList == (ExprList *)0x0) goto LAB_0015d436;
    pList->a[0].sortOrder = pParse->iPkSortOrder;
    sqlite3CreateIndex(pParse,(Token *)0x0,(Token *)0x0,(SrcList *)0x0,pList,(uint)pTab->keyConf,
                       (Token *)0x0,(Expr *)0x0,0,0,'\x02');
    if ((db->mallocFailed != '\0') || (pParse->nErr != 0)) goto LAB_0015d436;
    pIVar15 = sqlite3PrimaryKeyIndex(pTab);
    pTab->iPKey = -1;
  }
  uVar17 = *(ushort *)&pIVar15->field_0x63;
  *(ushort *)&pIVar15->field_0x63 = uVar17 | 0x20;
  if (((db->init).field_0x6 & 2) == 0) {
    *(ushort *)&pIVar15->field_0x63 = uVar17 | 0x28;
  }
  local_88 = (uint)pIVar15->nKeyCol;
  if ((pVVar12 != (Vdbe *)0x0) && (0 < pIVar15->tnum)) {
    pVVar14 = sqlite3VdbeGetOp(pVVar12,pIVar15->tnum);
    pVVar14->opcode = '\v';
  }
  pIVar15->tnum = pTab->tnum;
  ppIVar26 = &pTab->pIndex;
  while (pIdx = *ppIVar26, pIdx != (Index *)0x0) {
    if ((*(ushort *)&pIdx->field_0x63 & 3) != 2) {
      uVar17 = pIdx->nKeyCol;
      iVar6 = 0;
      for (uVar23 = 0; local_88 != uVar23; uVar23 = uVar23 + 1) {
        uVar10 = hasColumn(pIdx->aiColumn,(uint)uVar17,(int)pIVar15->aiColumn[uVar23]);
        iVar6 = iVar6 + (uVar10 ^ 1);
      }
      if (iVar6 == 0) {
        pIdx->nColumn = uVar17;
      }
      else {
        iVar6 = resizeIndexObject(db,pIdx,iVar6 + (uint)uVar17);
        if (iVar6 != 0) goto LAB_0015d436;
        uVar10 = (uint)pIdx->nKeyCol;
        for (uVar23 = 0; local_88 != uVar23; uVar23 = uVar23 + 1) {
          piVar3 = pIdx->aiColumn;
          sVar1 = pIVar15->aiColumn[uVar23];
          iVar6 = hasColumn(piVar3,(uint)pIdx->nKeyCol,(int)sVar1);
          if (iVar6 == 0) {
            piVar3[(int)uVar10] = sVar1;
            pIdx->azColl[(int)uVar10] = pIVar15->azColl[uVar23];
            uVar10 = uVar10 + 1;
          }
        }
      }
    }
    ppIVar26 = &pIdx->pNext;
  }
  uVar2 = pTab->nCol;
  if ((int)local_88 < (int)(short)uVar2) {
    iVar6 = resizeIndexObject(db,pIVar15,(int)(short)uVar2);
    if (iVar6 != 0) goto LAB_0015d436;
    for (iVar6 = 0; iVar6 < pTab->nCol; iVar6 = iVar6 + 1) {
      piVar3 = pIVar15->aiColumn;
      iVar7 = hasColumn(piVar3,local_88,iVar6);
      if (iVar7 == 0) {
        piVar3[(int)local_88] = (i16)iVar6;
        pIVar15->azColl[(int)local_88] = "BINARY";
        local_88 = local_88 + 1;
      }
    }
  }
  else {
    pIVar15->nColumn = uVar2;
  }
  recomputeColumnsNotIndexed(pIVar15);
LAB_0015d436:
  iVar6 = sqlite3SchemaToIndex(db,pTab->pSchema);
  if (pTab->pCheck != (ExprList *)0x0) {
    sqlite3ResolveSelfReference(pParse,pTab,4,(Expr *)0x0,pTab->pCheck);
  }
  puVar18 = &pTab->aCol->szEst;
  iVar25 = 0;
  for (iVar7 = (int)pTab->nCol; 0 < iVar7; iVar7 = iVar7 + -1) {
    iVar25 = iVar25 + (uint)*puVar18;
    puVar18 = puVar18 + 0x20;
  }
  LVar5 = sqlite3LogEst((ulong)((iVar25 + (uint)((ushort)pTab->iPKey >> 0xf)) * 4));
  pTab->szTabRow = LVar5;
  ppIVar26 = &pTab->pIndex;
  while (pIVar15 = *ppIVar26, pIVar15 != (Index *)0x0) {
    estimateIndexWidth(pIVar15);
    ppIVar26 = &pIVar15->pNext;
  }
  if ((db->init).busy == '\0') {
    pVVar12 = sqlite3GetVdbe(pParse);
    if (pVVar12 == (Vdbe *)0x0) {
      return;
    }
    sqlite3VdbeAddOp1(pVVar12,0x75,0);
    bVar28 = pTab->pSelect == (Select *)0x0;
    pcVar24 = "VIEW";
    if (bVar28) {
      pcVar24 = "TABLE";
    }
    pcVar19 = "view";
    if (bVar28) {
      pcVar19 = "table";
    }
    if (pSelect == (Select *)0x0) {
      pTVar16 = &pParse->sLastToken;
      if (tabOpts == '\0') {
        pTVar16 = pEnd;
      }
      uVar10 = (int)pTVar16->z - (int)(pParse->sNameToken).z;
      if (*pTVar16->z != ';') {
        uVar10 = uVar10 + pTVar16->n;
      }
      pcVar24 = sqlite3MPrintf(db,"CREATE %s %.*s",pcVar24,(ulong)uVar10);
    }
    else {
      iVar8 = pParse->nMem;
      iVar7 = iVar8 + 1;
      iVar25 = iVar8 + 3;
      pParse->nMem = iVar25;
      pPVar13 = pParse->pToplevel;
      if (pParse->pToplevel == (Parse *)0x0) {
        pPVar13 = pParse;
      }
      pPVar13->mayAbort = '\x01';
      sqlite3VdbeAddOp3(pVVar12,0x6e,1,pParse->regRoot,iVar6);
      iVar9 = pVVar12->nOp;
      if (0 < (long)iVar9) {
        pVVar12->aOp[(long)iVar9 + -1].p5 = 0x10;
      }
      pParse->nTab = 2;
      sqlite3VdbeAddOp3(pVVar12,0xd,iVar7,0,iVar9 + 1);
      if (pParse->nErr != 0) {
        return;
      }
      pTable = sqlite3ResultSetOfSelect(pParse,pSelect);
      if (pTable == (Table *)0x0) {
        return;
      }
      pTab->nCol = pTable->nCol;
      pTab->aCol = pTable->aCol;
      pTable->nCol = 0;
      pTable->aCol = (Column *)0x0;
      sqlite3DeleteTable(db,pTable);
      dest.eDest = '\r';
      dest.iSDParm = iVar7;
      dest.iSdst = 0;
      dest.nSdst = 0;
      dest.zAffSdst = (char *)0x0;
      sqlite3Select(pParse,pSelect,&dest);
      if (pParse->nErr != 0) {
        return;
      }
      sqlite3VdbeEndCoroutine(pVVar12,iVar7);
      sqlite3VdbeJumpHere(pVVar12,iVar9);
      iVar7 = sqlite3VdbeAddOp1(pVVar12,0xe,dest.iSDParm);
      sqlite3VdbeAddOp3(pVVar12,0x66,dest.iSdst,dest.nSdst,iVar8 + 2);
      lVar21 = 0;
      sqlite3TableAffinity(pVVar12,pTab,0);
      sqlite3VdbeAddOp2(pVVar12,0x79,1,iVar25);
      sqlite3VdbeAddOp3(pVVar12,0x7a,1,iVar8 + 2,iVar25);
      sqlite3VdbeGoto(pVVar12,iVar7);
      sqlite3VdbeJumpHere(pVVar12,iVar7);
      sqlite3VdbeAddOp1(pVVar12,0x75,1);
      pCVar22 = pTab->aCol;
      sVar1 = pTab->nCol;
      iVar7 = 0;
      if (0 < sVar1) {
        iVar7 = (int)sVar1;
      }
      iVar25 = 0;
      for (; iVar7 << 5 != (int)lVar21; lVar21 = lVar21 + 0x20) {
        iVar8 = identLength(*(char **)((long)&pCVar22->zName + lVar21));
        iVar25 = iVar25 + iVar8 + 5;
      }
      iVar7 = identLength(pTab->zName);
      iVar7 = iVar7 + iVar25;
      pcVar20 = ",\n  ";
      if (iVar7 < 0x32) {
        pcVar20 = ",";
      }
      pcVar27 = "\n)";
      if (iVar7 < 0x32) {
        pcVar27 = ")";
      }
      iVar25 = sVar1 * 6 + iVar7 + 0x23;
      pcVar24 = (char *)sqlite3Malloc((long)iVar25);
      if (pcVar24 == (char *)0x0) {
        sqlite3OomFault(db);
      }
      else {
        zFormat = "\n  ";
        if (iVar7 < 0x32) {
          zFormat = "";
        }
        sqlite3_snprintf(iVar25,pcVar24,"CREATE TABLE ");
        iVar7 = sqlite3Strlen30(pcVar24);
        dest._0_4_ = iVar7;
        identPut(pcVar24,(int *)&dest,pTab->zName);
        iVar8 = dest._0_4_ + 1;
        pcVar24[(int)dest._0_4_] = '(';
        pCVar22 = pTab->aCol;
        iVar7 = 0;
        while( true ) {
          zBuf = pcVar24 + iVar8;
          if (pTab->nCol <= iVar7) break;
          sqlite3_snprintf(iVar25 - iVar8,zBuf,zFormat);
          iVar9 = sqlite3Strlen30(zBuf);
          dest._0_4_ = iVar9 + iVar8;
          identPut(pcVar24,(int *)&dest,pCVar22->zName);
          z = (&sqlite3Apis.close_v2)[pCVar22->affinity];
          uVar10 = sqlite3Strlen30((char *)z);
          uVar4 = dest._0_4_;
          memcpy(pcVar24 + (int)dest._0_4_,z,(ulong)uVar10);
          iVar8 = uVar10 + uVar4;
          dest._0_4_ = iVar8;
          iVar7 = iVar7 + 1;
          pCVar22 = pCVar22 + 1;
          zFormat = pcVar20;
        }
        sqlite3_snprintf(iVar25 - iVar8,zBuf,"%s",pcVar27);
      }
    }
    sqlite3NestedParse(pParse,
                       "UPDATE %Q.%s SET type=\'%s\', name=%Q, tbl_name=%Q, rootpage=#%d, sql=%Q WHERE rowid=#%d"
                       ,db->aDb[iVar6].zDbSName,"sqlite_master",pcVar19,pTab->zName,pTab->zName,
                       (ulong)(uint)pParse->regRoot,pcVar24,(ulong)(uint)pParse->regRowid);
    sqlite3DbFree(db,pcVar24);
    sqlite3ChangeCookie(pParse,iVar6);
    if (((pTab->tabFlags & 8) != 0) && ((db->aDb[iVar6].pSchema)->pSeqTab == (Table *)0x0)) {
      sqlite3NestedParse(pParse,"CREATE TABLE %Q.sqlite_sequence(name,seq)",db->aDb[iVar6].zDbSName)
      ;
    }
    pcVar24 = sqlite3MPrintf(db,"tbl_name=\'%q\' AND type!=\'trigger\'",pTab->zName);
    sqlite3VdbeAddParseSchemaOp(pVVar12,iVar6,pcVar24);
    if ((db->init).busy == '\0') {
      return;
    }
  }
  pvVar11 = sqlite3HashInsert(&pTab->pSchema->tblHash,pTab->zName,pTab);
  if (pvVar11 == (void *)0x0) {
    pParse->pNewTable = (Table *)0x0;
    *(byte *)&db->mDbFlags = (byte)db->mDbFlags | 1;
    if (pTab->pSelect == (Select *)0x0) {
      pcVar24 = (pParse->sNameToken).z;
      if (pCons->z != (char *)0x0) {
        pEnd = pCons;
      }
      iVar6 = sqlite3Utf8CharLen(pcVar24,*(int *)&pEnd->z - (int)pcVar24);
      pTab->addColOffset = iVar6 + 0xd;
    }
  }
  else {
    sqlite3OomFault(db);
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3EndTable(
  Parse *pParse,          /* Parse context */
  Token *pCons,           /* The ',' token after the last column defn. */
  Token *pEnd,            /* The ')' before options in the CREATE TABLE */
  u8 tabOpts,             /* Extra table options. Usually 0. */
  Select *pSelect         /* Select from a "CREATE ... AS SELECT" */
){
  Table *p;                 /* The new table */
  sqlite3 *db = pParse->db; /* The database connection */
  int iDb;                  /* Database in which the table lives */
  Index *pIdx;              /* An implied index of the table */

  if( pEnd==0 && pSelect==0 ){
    return;
  }
  assert( !db->mallocFailed );
  p = pParse->pNewTable;
  if( p==0 ) return;

  /* If the db->init.busy is 1 it means we are reading the SQL off the
  ** "sqlite_master" or "sqlite_temp_master" table on the disk.
  ** So do not write to the disk again.  Extract the root page number
  ** for the table from the db->init.newTnum field.  (The page number
  ** should have been put there by the sqliteOpenCb routine.)
  **
  ** If the root page number is 1, that means this is the sqlite_master
  ** table itself.  So mark it read-only.
  */
  if( db->init.busy ){
    if( pSelect ){
      sqlite3ErrorMsg(pParse, "");
      return;
    }
    p->tnum = db->init.newTnum;
    if( p->tnum==1 ) p->tabFlags |= TF_Readonly;
  }

  /* Special processing for WITHOUT ROWID Tables */
  if( tabOpts & TF_WithoutRowid ){
    if( (p->tabFlags & TF_Autoincrement) ){
      sqlite3ErrorMsg(pParse,
          "AUTOINCREMENT not allowed on WITHOUT ROWID tables");
      return;
    }
    if( (p->tabFlags & TF_HasPrimaryKey)==0 ){
      sqlite3ErrorMsg(pParse, "PRIMARY KEY missing on table %s", p->zName);
    }else{
      p->tabFlags |= TF_WithoutRowid | TF_NoVisibleRowid;
      convertToWithoutRowidTable(pParse, p);
    }
  }

  iDb = sqlite3SchemaToIndex(db, p->pSchema);

#ifndef SQLITE_OMIT_CHECK
  /* Resolve names in all CHECK constraint expressions.
  */
  if( p->pCheck ){
    sqlite3ResolveSelfReference(pParse, p, NC_IsCheck, 0, p->pCheck);
  }
#endif /* !defined(SQLITE_OMIT_CHECK) */

  /* Estimate the average row size for the table and for all implied indices */
  estimateTableWidth(p);
  for(pIdx=p->pIndex; pIdx; pIdx=pIdx->pNext){
    estimateIndexWidth(pIdx);
  }

  /* If not initializing, then create a record for the new table
  ** in the SQLITE_MASTER table of the database.
  **
  ** If this is a TEMPORARY table, write the entry into the auxiliary
  ** file instead of into the main database file.
  */
  if( !db->init.busy ){
    int n;
    Vdbe *v;
    char *zType;    /* "view" or "table" */
    char *zType2;   /* "VIEW" or "TABLE" */
    char *zStmt;    /* Text of the CREATE TABLE or CREATE VIEW statement */

    v = sqlite3GetVdbe(pParse);
    if( NEVER(v==0) ) return;

    sqlite3VdbeAddOp1(v, OP_Close, 0);

    /* 
    ** Initialize zType for the new view or table.
    */
    if( p->pSelect==0 ){
      /* A regular table */
      zType = "table";
      zType2 = "TABLE";
#ifndef SQLITE_OMIT_VIEW
    }else{
      /* A view */
      zType = "view";
      zType2 = "VIEW";
#endif
    }

    /* If this is a CREATE TABLE xx AS SELECT ..., execute the SELECT
    ** statement to populate the new table. The root-page number for the
    ** new table is in register pParse->regRoot.
    **
    ** Once the SELECT has been coded by sqlite3Select(), it is in a
    ** suitable state to query for the column names and types to be used
    ** by the new table.
    **
    ** A shared-cache write-lock is not required to write to the new table,
    ** as a schema-lock must have already been obtained to create it. Since
    ** a schema-lock excludes all other database users, the write-lock would
    ** be redundant.
    */
    if( pSelect ){
      SelectDest dest;    /* Where the SELECT should store results */
      int regYield;       /* Register holding co-routine entry-point */
      int addrTop;        /* Top of the co-routine */
      int regRec;         /* A record to be insert into the new table */
      int regRowid;       /* Rowid of the next row to insert */
      int addrInsLoop;    /* Top of the loop for inserting rows */
      Table *pSelTab;     /* A table that describes the SELECT results */

      regYield = ++pParse->nMem;
      regRec = ++pParse->nMem;
      regRowid = ++pParse->nMem;
      assert(pParse->nTab==1);
      sqlite3MayAbort(pParse);
      sqlite3VdbeAddOp3(v, OP_OpenWrite, 1, pParse->regRoot, iDb);
      sqlite3VdbeChangeP5(v, OPFLAG_P2ISREG);
      pParse->nTab = 2;
      addrTop = sqlite3VdbeCurrentAddr(v) + 1;
      sqlite3VdbeAddOp3(v, OP_InitCoroutine, regYield, 0, addrTop);
      if( pParse->nErr ) return;
      pSelTab = sqlite3ResultSetOfSelect(pParse, pSelect);
      if( pSelTab==0 ) return;
      assert( p->aCol==0 );
      p->nCol = pSelTab->nCol;
      p->aCol = pSelTab->aCol;
      pSelTab->nCol = 0;
      pSelTab->aCol = 0;
      sqlite3DeleteTable(db, pSelTab);
      sqlite3SelectDestInit(&dest, SRT_Coroutine, regYield);
      sqlite3Select(pParse, pSelect, &dest);
      if( pParse->nErr ) return;
      sqlite3VdbeEndCoroutine(v, regYield);
      sqlite3VdbeJumpHere(v, addrTop - 1);
      addrInsLoop = sqlite3VdbeAddOp1(v, OP_Yield, dest.iSDParm);
      VdbeCoverage(v);
      sqlite3VdbeAddOp3(v, OP_MakeRecord, dest.iSdst, dest.nSdst, regRec);
      sqlite3TableAffinity(v, p, 0);
      sqlite3VdbeAddOp2(v, OP_NewRowid, 1, regRowid);
      sqlite3VdbeAddOp3(v, OP_Insert, 1, regRec, regRowid);
      sqlite3VdbeGoto(v, addrInsLoop);
      sqlite3VdbeJumpHere(v, addrInsLoop);
      sqlite3VdbeAddOp1(v, OP_Close, 1);
    }

    /* Compute the complete text of the CREATE statement */
    if( pSelect ){
      zStmt = createTableStmt(db, p);
    }else{
      Token *pEnd2 = tabOpts ? &pParse->sLastToken : pEnd;
      n = (int)(pEnd2->z - pParse->sNameToken.z);
      if( pEnd2->z[0]!=';' ) n += pEnd2->n;
      zStmt = sqlite3MPrintf(db, 
          "CREATE %s %.*s", zType2, n, pParse->sNameToken.z
      );
    }

    /* A slot for the record has already been allocated in the 
    ** SQLITE_MASTER table.  We just need to update that slot with all
    ** the information we've collected.
    */
    sqlite3NestedParse(pParse,
      "UPDATE %Q.%s "
         "SET type='%s', name=%Q, tbl_name=%Q, rootpage=#%d, sql=%Q "
       "WHERE rowid=#%d",
      db->aDb[iDb].zDbSName, MASTER_NAME,
      zType,
      p->zName,
      p->zName,
      pParse->regRoot,
      zStmt,
      pParse->regRowid
    );
    sqlite3DbFree(db, zStmt);
    sqlite3ChangeCookie(pParse, iDb);

#ifndef SQLITE_OMIT_AUTOINCREMENT
    /* Check to see if we need to create an sqlite_sequence table for
    ** keeping track of autoincrement keys.
    */
    if( (p->tabFlags & TF_Autoincrement)!=0 ){
      Db *pDb = &db->aDb[iDb];
      assert( sqlite3SchemaMutexHeld(db, iDb, 0) );
      if( pDb->pSchema->pSeqTab==0 ){
        sqlite3NestedParse(pParse,
          "CREATE TABLE %Q.sqlite_sequence(name,seq)",
          pDb->zDbSName
        );
      }
    }
#endif

    /* Reparse everything to update our internal data structures */
    sqlite3VdbeAddParseSchemaOp(v, iDb,
           sqlite3MPrintf(db, "tbl_name='%q' AND type!='trigger'", p->zName));
  }


  /* Add the table to the in-memory representation of the database.
  */
  if( db->init.busy ){
    Table *pOld;
    Schema *pSchema = p->pSchema;
    assert( sqlite3SchemaMutexHeld(db, iDb, 0) );
    pOld = sqlite3HashInsert(&pSchema->tblHash, p->zName, p);
    if( pOld ){
      assert( p==pOld );  /* Malloc must have failed inside HashInsert() */
      sqlite3OomFault(db);
      return;
    }
    pParse->pNewTable = 0;
    db->mDbFlags |= DBFLAG_SchemaChange;

#ifndef SQLITE_OMIT_ALTERTABLE
    if( !p->pSelect ){
      const char *zName = (const char *)pParse->sNameToken.z;
      int nName;
      assert( !pSelect && pCons && pEnd );
      if( pCons->z==0 ){
        pCons = pEnd;
      }
      nName = (int)((const char *)pCons->z - zName);
      p->addColOffset = 13 + sqlite3Utf8CharLen(zName, nName);
    }
#endif
  }
}